

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

bool __thiscall
Catch::Detail::CaseInsensitiveLess::operator()
          (CaseInsensitiveLess *this,StringRef lhs,StringRef rhs)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *__it2;
  char *__it2_00;
  char *extraout_RDX;
  difference_type __diff2;
  char *pcVar4;
  char *__it1;
  char *pcVar5;
  difference_type __diff1;
  char *__it1_00;
  
  pcVar4 = (char *)rhs.m_size;
  __it1_00 = rhs.m_start;
  pcVar3 = (char *)lhs.m_size;
  __it1 = lhs.m_start;
  __it2 = pcVar3;
  pcVar5 = pcVar3;
  if ((long)pcVar4 < (long)pcVar3) {
    pcVar5 = pcVar4;
  }
  while( true ) {
    if (pcVar5 == (char *)0x0) {
      return (long)pcVar3 < (long)pcVar4;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_comp_iter<Catch::Detail::CaseInsensitiveLess::operator()(Catch::StringRef,Catch::StringRef)const::$_0>
            ::operator()(__it1,__it1_00,__it2);
    if (bVar1) break;
    bVar2 = __gnu_cxx::__ops::
            _Iter_comp_iter<Catch::Detail::CaseInsensitiveLess::operator()(Catch::StringRef,Catch::StringRef)const::$_0>
            ::operator()(__it1_00,__it1,__it2_00);
    if (bVar2) {
      return bVar1;
    }
    __it1 = __it1 + 1;
    __it1_00 = __it1_00 + 1;
    pcVar5 = pcVar5 + -1;
    __it2 = extraout_RDX;
  }
  return bVar1;
}

Assistant:

bool CaseInsensitiveLess::operator()( StringRef lhs,
                                              StringRef rhs ) const {
            return std::lexicographical_compare(
                lhs.begin(), lhs.end(),
                rhs.begin(), rhs.end(),
                []( char l, char r ) { return toLower( l ) < toLower( r ); } );
        }